

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Tracks::Write(Tracks *this,IMkvWriter *writer)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Track *pTVar6;
  undefined4 extraout_var;
  int extraout_var_00;
  int extraout_var_01;
  int64_t stop_position;
  Track *track_1;
  int32_t i_1;
  int64_t payload_position;
  Track *track;
  int32_t i;
  int32_t count;
  uint64_t size;
  IMkvWriter *writer_local;
  Tracks *this_local;
  
  _i = 0;
  uVar2 = track_entries_size(this);
  for (track._0_4_ = 0; (int)(uint32_t)track < (int)uVar2; track._0_4_ = (uint32_t)track + 1) {
    pTVar6 = GetTrackByIndex(this,(uint32_t)track);
    if (pTVar6 == (Track *)0x0) {
      return false;
    }
    iVar3 = (*pTVar6->_vptr_Track[4])();
    _i = CONCAT44(extraout_var,iVar3) + _i;
  }
  bVar1 = WriteEbmlMasterElement(writer,0x1654ae6b,_i);
  if (bVar1) {
    iVar3 = (*writer->_vptr_IMkvWriter[1])();
    if (extraout_var_00 < 0) {
      this_local._7_1_ = false;
    }
    else {
      for (track_1._4_4_ = 0; (int)track_1._4_4_ < (int)uVar2; track_1._4_4_ = track_1._4_4_ + 1) {
        pTVar6 = GetTrackByIndex(this,track_1._4_4_);
        uVar4 = (*pTVar6->_vptr_Track[5])(pTVar6,writer);
        if ((uVar4 & 1) == 0) {
          return false;
        }
      }
      iVar5 = (*writer->_vptr_IMkvWriter[1])();
      if ((extraout_var_01 < 0) ||
         (CONCAT44(extraout_var_01,iVar5) - CONCAT44(extraout_var_00,iVar3) != _i)) {
        this_local._7_1_ = false;
      }
      else {
        this->wrote_tracks_ = true;
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Tracks::Write(IMkvWriter* writer) const {
  uint64_t size = 0;
  const int32_t count = track_entries_size();
  for (int32_t i = 0; i < count; ++i) {
    const Track* const track = GetTrackByIndex(i);

    if (!track)
      return false;

    size += track->Size();
  }

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvTracks, size))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  for (int32_t i = 0; i < count; ++i) {
    const Track* const track = GetTrackByIndex(i);
    if (!track->Write(writer))
      return false;
  }

  const int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(size))
    return false;

  wrote_tracks_ = true;
  return true;
}